

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

String * __thiscall asl::String::operator=(String *this,String *s)

{
  anon_union_16_2_78e7fdac_for_String_2 *b;
  
  if (s->_size == 0) {
    b = &s->field_2;
  }
  else {
    b = (anon_union_16_2_78e7fdac_for_String_2 *)(s->field_2)._str;
  }
  assign(this,b->_space,s->_len);
  return this;
}

Assistant:

String& operator=(const String& s) { assign(s.str(), s._len); return *this; }